

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O3

int OBJ_create(char *oid,char *sn,char *ln)

{
  uint uVar1;
  uint uVar2;
  ASN1_OBJECT *data;
  bool bVar3;
  void *old_data_void;
  void *local_18;
  
  data = create_object_with_text_oid(obj_next_nid,oid,sn,ln);
  if (data != (ASN1_OBJECT *)0x0) {
    *(byte *)&data->flags = (byte)data->flags & 0xf2;
    CRYPTO_MUTEX_lock_write(&global_added_lock);
    if (global_added_by_nid == (lhash_st_ASN1_OBJECT *)0x0) {
      global_added_by_nid = (lhash_st_ASN1_OBJECT *)OPENSSL_lh_new(hash_nid,cmp_nid);
    }
    if (global_added_by_data == (lhash_st_ASN1_OBJECT *)0x0) {
      global_added_by_data = (lhash_st_ASN1_OBJECT *)OPENSSL_lh_new(hash_data,OBJ_cmp);
    }
    if (global_added_by_short_name == (lhash_st_ASN1_OBJECT *)0x0) {
      global_added_by_short_name =
           (lhash_st_ASN1_OBJECT *)OPENSSL_lh_new(hash_short_name,cmp_short_name);
    }
    if (global_added_by_long_name == (lhash_st_ASN1_OBJECT *)0x0) {
      global_added_by_long_name =
           (lhash_st_ASN1_OBJECT *)OPENSSL_lh_new(hash_long_name,cmp_long_name);
      bVar3 = (_LHASH *)global_added_by_long_name == (_LHASH *)0x0;
    }
    else {
      bVar3 = false;
    }
    if ((((bVar3) || (global_added_by_nid == (lhash_st_ASN1_OBJECT *)0x0)) ||
        (global_added_by_data == (lhash_st_ASN1_OBJECT *)0x0)) ||
       (global_added_by_short_name == (lhash_st_ASN1_OBJECT *)0x0)) {
      CRYPTO_MUTEX_unlock_write(&global_added_lock);
    }
    else {
      local_18 = (void *)0x0;
      uVar1 = OPENSSL_lh_insert((_LHASH *)global_added_by_nid,&local_18,data,
                                lh_ASN1_OBJECT_call_hash_func,lh_ASN1_OBJECT_call_cmp_func);
      if ((data->length != 0) && (data->data != (uchar *)0x0)) {
        local_18 = (void *)0x0;
        uVar2 = OPENSSL_lh_insert((_LHASH *)global_added_by_data,&local_18,data,
                                  lh_ASN1_OBJECT_call_hash_func,lh_ASN1_OBJECT_call_cmp_func);
        uVar1 = uVar1 & uVar2;
      }
      if (data->sn != (char *)0x0) {
        local_18 = (void *)0x0;
        uVar2 = OPENSSL_lh_insert((_LHASH *)global_added_by_short_name,&local_18,data,
                                  lh_ASN1_OBJECT_call_hash_func,lh_ASN1_OBJECT_call_cmp_func);
        uVar1 = uVar1 & uVar2;
      }
      if (data->ln != (char *)0x0) {
        local_18 = (void *)0x0;
        uVar2 = OPENSSL_lh_insert((_LHASH *)global_added_by_long_name,&local_18,data,
                                  lh_ASN1_OBJECT_call_hash_func,lh_ASN1_OBJECT_call_cmp_func);
        uVar1 = uVar1 & uVar2;
      }
      CRYPTO_MUTEX_unlock_write(&global_added_lock);
      if (uVar1 != 0) {
        return data->nid;
      }
    }
  }
  return 0;
}

Assistant:

int OBJ_create(const char *oid, const char *short_name, const char *long_name) {
  ASN1_OBJECT *op =
      create_object_with_text_oid(obj_next_nid, oid, short_name, long_name);
  if (op == NULL || !obj_add_object(op)) {
    return NID_undef;
  }
  return op->nid;
}